

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O3

int64 google::protobuf::operator/(Duration *d1,Duration *d2)

{
  uint128 *puVar1;
  uint64 uVar2;
  uint128 local_68;
  undefined1 auStack_58 [8];
  uint128 value1;
  uint128 value2;
  bool negative1;
  bool negative2;
  
  auStack_58 = (undefined1  [8])0x0;
  value1.lo_ = 0;
  value1.hi_ = 0;
  value2.lo_ = 0;
  anon_unknown_26::ToUint128(d1,(uint128 *)auStack_58,(bool *)((long)&value2.hi_ + 6));
  anon_unknown_26::ToUint128(d2,(uint128 *)&value1.hi_,(bool *)((long)&value2.hi_ + 7));
  local_68.lo_ = (uint64)auStack_58;
  local_68.hi_ = value1.lo_;
  puVar1 = uint128::operator/=(&local_68,(uint128 *)&value1.hi_);
  uVar2 = -puVar1->lo_;
  if (value2.hi_._6_1_ == value2.hi_._7_1_) {
    uVar2 = puVar1->lo_;
  }
  return uVar2;
}

Assistant:

int64 operator/(const Duration& d1, const Duration& d2) {
  bool negative1, negative2;
  uint128 value1, value2;
  ToUint128(d1, &value1, &negative1);
  ToUint128(d2, &value2, &negative2);
  int64 result = Uint128Low64(value1 / value2);
  if (negative1 != negative2) {
    result = -result;
  }
  return result;
}